

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvIntersector1Pluecker<4,_true>_>_>
::occluded(BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvIntersector1Pluecker<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Collider CVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  Intersectors *pIVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar32;
  float fVar35;
  undefined1 auVar26 [16];
  float fVar33;
  float fVar34;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [16];
  float fVar68;
  float fVar73;
  float fVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar91;
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  long local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  Ray *local_a98;
  int local_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  undefined1 local_a68 [16];
  ulong *local_a50;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined8 local_a18;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  RayQueryContext *local_9f8;
  RayQueryContext *local_9f0;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  uint local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  int *local_9b8;
  undefined8 local_9b0;
  undefined4 *local_9a8;
  Intersectors *local_9a0;
  undefined4 *local_998;
  undefined4 local_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (local_8e8 = *(float *)&(This->intersector1).intersect, 0.0 <= local_8e8)) {
    puVar16 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_938 = *(float *)&This->ptr;
    local_948 = *(float *)((long)&This->ptr + 4);
    local_8f8 = *(float *)&This->leafIntersector;
    fVar56 = *(float *)((long)&This->leafIntersector + 4);
    CVar5 = This->collider;
    auVar70._4_4_ = -(uint)(ABS(CVar5.collide._4_4_) < 1e-18);
    auVar70._0_4_ = -(uint)(ABS(CVar5.collide._0_4_) < 1e-18);
    auVar70._8_4_ = -(uint)(ABS(CVar5.name._0_4_) < 1e-18);
    auVar70._12_4_ = -(uint)(ABS(CVar5.name._4_4_) < 1e-18);
    auVar69 = divps(_DAT_01f7ba10,(undefined1  [16])CVar5);
    auVar70 = blendvps(auVar69,_DAT_01fab950,auVar70);
    local_958 = auVar70._0_4_ * 0.99999964;
    local_968 = auVar70._4_4_ * 0.99999964;
    local_928 = auVar70._8_4_ * 0.99999964;
    local_978 = auVar70._0_4_ * 1.0000004;
    local_988 = auVar70._4_4_ * 1.0000004;
    local_918 = auVar70._8_4_ * 1.0000004;
    fVar40 = 0.0;
    if (0.0 <= fVar56) {
      fVar40 = fVar56;
    }
    local_a18 = (ulong)(local_958 < 0.0) << 4;
    uVar17 = (ulong)(local_968 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(local_928 < 0.0) << 4 | 0x40;
    uVar21 = local_a18 ^ 0x10;
    local_908._4_4_ = fVar40;
    local_908._0_4_ = fVar40;
    local_908._8_4_ = fVar40;
    local_908._12_4_ = fVar40;
    local_898 = mm_lookupmask_ps._240_16_;
    local_a48 = This;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_8f4 = local_8f8;
    fStack_8f0 = local_8f8;
    fStack_8ec = local_8f8;
    fStack_954 = local_958;
    fStack_950 = local_958;
    fStack_94c = local_958;
    fStack_964 = local_968;
    fStack_960 = local_968;
    fStack_95c = local_968;
    fStack_984 = local_988;
    fStack_980 = local_988;
    fStack_97c = local_988;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fStack_974 = local_978;
    fStack_970 = local_978;
    fStack_96c = local_978;
    local_a98 = ray;
    do {
      uVar22 = puVar16[-1];
      puVar16 = puVar16 + -1;
      while ((uVar22 & 8) == 0) {
        pfVar1 = (float *)(uVar22 + 0x20 + local_a18);
        auVar44._0_4_ = (*pfVar1 - local_938) * local_958;
        auVar44._4_4_ = (pfVar1[1] - fStack_934) * fStack_954;
        auVar44._8_4_ = (pfVar1[2] - fStack_930) * fStack_950;
        auVar44._12_4_ = (pfVar1[3] - fStack_92c) * fStack_94c;
        pfVar1 = (float *)(uVar22 + 0x20 + uVar17);
        auVar41._0_4_ = (*pfVar1 - local_948) * local_968;
        auVar41._4_4_ = (pfVar1[1] - fStack_944) * fStack_964;
        auVar41._8_4_ = (pfVar1[2] - fStack_940) * fStack_960;
        auVar41._12_4_ = (pfVar1[3] - fStack_93c) * fStack_95c;
        auVar70 = maxps(auVar44,auVar41);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar20);
        auVar42._0_4_ = (*pfVar1 - local_8f8) * local_928;
        auVar42._4_4_ = (pfVar1[1] - fStack_8f4) * fStack_924;
        auVar42._8_4_ = (pfVar1[2] - fStack_8f0) * fStack_920;
        auVar42._12_4_ = (pfVar1[3] - fStack_8ec) * fStack_91c;
        auVar69 = maxps(auVar42,local_908);
        auVar70 = maxps(auVar70,auVar69);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar21);
        auVar43._0_4_ = (*pfVar1 - local_938) * local_978;
        auVar43._4_4_ = (pfVar1[1] - fStack_934) * fStack_974;
        auVar43._8_4_ = (pfVar1[2] - fStack_930) * fStack_970;
        auVar43._12_4_ = (pfVar1[3] - fStack_92c) * fStack_96c;
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar17 ^ 0x10));
        auVar46._0_4_ = (*pfVar1 - local_948) * local_988;
        auVar46._4_4_ = (pfVar1[1] - fStack_944) * fStack_984;
        auVar46._8_4_ = (pfVar1[2] - fStack_940) * fStack_980;
        auVar46._12_4_ = (pfVar1[3] - fStack_93c) * fStack_97c;
        auVar44 = minps(auVar43,auVar46);
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar20 ^ 0x10));
        auVar47._0_4_ = (*pfVar1 - local_8f8) * local_918;
        auVar47._4_4_ = (pfVar1[1] - fStack_8f4) * fStack_914;
        auVar47._8_4_ = (pfVar1[2] - fStack_8f0) * fStack_910;
        auVar47._12_4_ = (pfVar1[3] - fStack_8ec) * fStack_90c;
        auVar69._4_4_ = fStack_8e4;
        auVar69._0_4_ = local_8e8;
        auVar69._8_4_ = fStack_8e0;
        auVar69._12_4_ = fStack_8dc;
        auVar69 = minps(auVar47,auVar69);
        auVar69 = minps(auVar44,auVar69);
        auVar26._4_4_ = -(uint)(auVar70._4_4_ <= auVar69._4_4_);
        auVar26._0_4_ = -(uint)(auVar70._0_4_ <= auVar69._0_4_);
        auVar26._8_4_ = -(uint)(auVar70._8_4_ <= auVar69._8_4_);
        auVar26._12_4_ = -(uint)(auVar70._12_4_ <= auVar69._12_4_);
        uVar15 = movmskps((int)context,auVar26);
        local_9f8 = (RayQueryContext *)(ulong)uVar15;
        if (uVar15 == 0) goto LAB_0021ae9f;
        context = (RayQueryContext *)(ulong)(byte)uVar15;
        uVar14 = uVar22 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar22 = *(ulong *)(uVar14 + lVar6 * 8);
        uVar15 = (uVar15 & 0xff) - 1 & uVar15 & 0xff;
        if (uVar15 != 0) {
          *puVar16 = uVar22;
          puVar16 = puVar16 + 1;
          lVar6 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar14 + lVar6 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          context = (RayQueryContext *)(ulong)uVar15;
          if (uVar15 != 0) {
            do {
              *puVar16 = uVar22;
              puVar16 = puVar16 + 1;
              lVar6 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              uVar22 = *(ulong *)(uVar14 + lVar6 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_9f8 = (RayQueryContext *)((ulong)((uint)uVar22 & 0xf) - 8);
      if (local_9f8 != (RayQueryContext *)0x0) {
        uVar22 = uVar22 & 0xfffffffffffffff0;
        local_9f0 = (RayQueryContext *)0x0;
        local_a50 = puVar16;
        pIVar18 = local_a48;
        uVar14 = local_a18;
        do {
          local_aa8 = (long)local_9f0 * 0xb0;
          fVar40 = *(float *)&pIVar18->ptr;
          fVar56 = *(float *)((long)&pIVar18->ptr + 4);
          fVar81 = *(float *)&pIVar18->leafIntersector;
          pfVar1 = (float *)(uVar22 + local_aa8);
          pfVar2 = (float *)(uVar22 + 0x10 + local_aa8);
          pfVar3 = (float *)(uVar22 + 0x20 + local_aa8);
          pfVar4 = (float *)(uVar22 + 0x30 + local_aa8);
          fVar94 = *pfVar1 - fVar40;
          fVar96 = pfVar1[1] - fVar40;
          fStack_a40 = pfVar1[2] - fVar40;
          fStack_a3c = pfVar1[3] - fVar40;
          fVar87 = *pfVar2 - fVar56;
          fVar88 = pfVar2[1] - fVar56;
          fStack_a10 = pfVar2[2] - fVar56;
          fStack_a0c = pfVar2[3] - fVar56;
          local_a28 = *pfVar3 - fVar81;
          fStack_a24 = pfVar3[1] - fVar81;
          fStack_a20 = pfVar3[2] - fVar81;
          fStack_a1c = pfVar3[3] - fVar81;
          fVar23 = *pfVar4 - fVar40;
          fVar32 = pfVar4[1] - fVar40;
          fVar35 = pfVar4[2] - fVar40;
          fVar38 = pfVar4[3] - fVar40;
          pfVar1 = (float *)(uVar22 + 0x40 + local_aa8);
          fVar59 = *pfVar1 - fVar56;
          fVar60 = pfVar1[1] - fVar56;
          fVar61 = pfVar1[2] - fVar56;
          fVar62 = pfVar1[3] - fVar56;
          pfVar1 = (float *)(uVar22 + 0x50 + local_aa8);
          fVar24 = *pfVar1 - fVar81;
          fVar33 = pfVar1[1] - fVar81;
          fVar36 = pfVar1[2] - fVar81;
          fVar39 = pfVar1[3] - fVar81;
          pfVar1 = (float *)(uVar22 + 0x60 + local_aa8);
          fVar25 = *pfVar1 - fVar40;
          fVar34 = pfVar1[1] - fVar40;
          fVar37 = pfVar1[2] - fVar40;
          fVar40 = pfVar1[3] - fVar40;
          pfVar1 = (float *)(uVar22 + 0x70 + local_aa8);
          fVar49 = *pfVar1 - fVar56;
          fVar54 = pfVar1[1] - fVar56;
          fVar55 = pfVar1[2] - fVar56;
          fVar56 = pfVar1[3] - fVar56;
          pfVar1 = (float *)(uVar22 + 0x80 + local_aa8);
          fVar77 = *pfVar1 - fVar81;
          fVar79 = pfVar1[1] - fVar81;
          fVar80 = pfVar1[2] - fVar81;
          fVar81 = pfVar1[3] - fVar81;
          fVar68 = fVar25 - fVar94;
          fVar73 = fVar34 - fVar96;
          fVar74 = fVar37 - fStack_a40;
          fVar75 = fVar40 - fStack_a3c;
          local_8a8 = fVar49 - fVar87;
          fStack_8a4 = fVar54 - fVar88;
          fStack_8a0 = fVar55 - fStack_a10;
          fStack_89c = fVar56 - fStack_a0c;
          fVar89 = fVar77 - local_a28;
          fVar91 = fVar79 - fStack_a24;
          fStack_a30 = fVar80 - fStack_a20;
          fStack_a2c = fVar81 - fStack_a1c;
          local_a78 = CONCAT44(fVar73,fVar68);
          fStack_a70 = fVar74;
          fStack_a6c = fVar75;
          local_a38 = (byte *)CONCAT44(fVar91,fVar89);
          fVar76 = *(float *)&(pIVar18->collider).collide;
          local_8c8 = *(float *)((long)&(pIVar18->collider).collide + 4);
          fStack_aa0 = *(float *)&(pIVar18->collider).name;
          local_888 = (local_8a8 * (local_a28 + fVar77) - (fVar87 + fVar49) * fVar89) * fVar76 +
                      ((fVar94 + fVar25) * fVar89 - (local_a28 + fVar77) * fVar68) * local_8c8 +
                      (fVar68 * (fVar87 + fVar49) - (fVar94 + fVar25) * local_8a8) * fStack_aa0;
          fStack_884 = (fStack_8a4 * (fStack_a24 + fVar79) - (fVar88 + fVar54) * fVar91) * fVar76 +
                       ((fVar96 + fVar34) * fVar91 - (fStack_a24 + fVar79) * fVar73) * local_8c8 +
                       (fVar73 * (fVar88 + fVar54) - (fVar96 + fVar34) * fStack_8a4) * fStack_aa0;
          local_a68._0_8_ = CONCAT44(fStack_884,local_888);
          local_a68._8_4_ =
               (fStack_8a0 * (fStack_a20 + fVar80) - (fStack_a10 + fVar55) * fStack_a30) * fVar76 +
               ((fStack_a40 + fVar37) * fStack_a30 - (fStack_a20 + fVar80) * fVar74) * local_8c8 +
               (fVar74 * (fStack_a10 + fVar55) - (fStack_a40 + fVar37) * fStack_8a0) * fStack_aa0;
          local_a68._12_4_ =
               (fStack_89c * (fStack_a1c + fVar81) - (fStack_a0c + fVar56) * fStack_a2c) * fVar76 +
               ((fStack_a3c + fVar40) * fStack_a2c - (fStack_a1c + fVar81) * fVar75) * local_8c8 +
               (fVar75 * (fStack_a0c + fVar56) - (fStack_a3c + fVar40) * fStack_89c) * fStack_aa0;
          fVar57 = fVar94 - fVar23;
          fVar58 = fVar96 - fVar32;
          fStack_a00 = fStack_a40 - fVar35;
          fStack_9fc = fStack_a3c - fVar38;
          fVar82 = fVar87 - fVar59;
          fVar84 = fVar88 - fVar60;
          fVar85 = fStack_a10 - fVar61;
          fVar86 = fStack_a0c - fVar62;
          fVar63 = local_a28 - fVar24;
          fVar65 = fStack_a24 - fVar33;
          fVar66 = fStack_a20 - fVar36;
          fVar67 = fStack_a1c - fVar39;
          local_a18 = CONCAT44(fVar88,fVar87);
          local_a08 = CONCAT44(fVar58,fVar57);
          local_a48 = (Intersectors *)CONCAT44(fVar96,fVar94);
          local_a88 = (fVar82 * (local_a28 + fVar24) - (fVar87 + fVar59) * fVar63) * fVar76 +
                      ((fVar94 + fVar23) * fVar63 - (local_a28 + fVar24) * fVar57) * local_8c8 +
                      (fVar57 * (fVar87 + fVar59) - (fVar94 + fVar23) * fVar82) * fStack_aa0;
          fStack_a84 = (fVar84 * (fStack_a24 + fVar33) - (fVar88 + fVar60) * fVar65) * fVar76 +
                       ((fVar96 + fVar32) * fVar65 - (fStack_a24 + fVar33) * fVar58) * local_8c8 +
                       (fVar58 * (fVar88 + fVar60) - (fVar96 + fVar32) * fVar84) * fStack_aa0;
          fStack_a80 = (fVar85 * (fStack_a20 + fVar36) - (fStack_a10 + fVar61) * fVar66) * fVar76 +
                       ((fStack_a40 + fVar35) * fVar66 - (fStack_a20 + fVar36) * fStack_a00) *
                       local_8c8 +
                       (fStack_a00 * (fStack_a10 + fVar61) - (fStack_a40 + fVar35) * fVar85) *
                       fStack_aa0;
          fStack_a7c = (fVar86 * (fStack_a1c + fVar39) - (fStack_a0c + fVar62) * fVar67) * fVar76 +
                       ((fStack_a3c + fVar38) * fVar67 - (fStack_a1c + fVar39) * fStack_9fc) *
                       local_8c8 +
                       (fStack_9fc * (fStack_a0c + fVar62) - (fStack_a3c + fVar38) * fVar86) *
                       fStack_aa0;
          local_8d8 = fVar23 - fVar25;
          fStack_8d4 = fVar32 - fVar34;
          fStack_8d0 = fVar35 - fVar37;
          fStack_8cc = fVar38 - fVar40;
          fVar92 = fVar59 - fVar49;
          fVar93 = fVar60 - fVar54;
          fStack_a70 = fVar61 - fVar55;
          fStack_a6c = fVar62 - fVar56;
          fVar95 = fVar24 - fVar77;
          fVar97 = fVar33 - fVar79;
          fVar98 = fVar36 - fVar80;
          fVar99 = fVar39 - fVar81;
          auVar48._0_4_ =
               (fVar92 * (fVar77 + fVar24) - (fVar49 + fVar59) * fVar95) * fVar76 +
               ((fVar25 + fVar23) * fVar95 - (fVar77 + fVar24) * local_8d8) * local_8c8 +
               (local_8d8 * (fVar49 + fVar59) - (fVar25 + fVar23) * fVar92) * fStack_aa0;
          auVar48._4_4_ =
               (fVar93 * (fVar79 + fVar33) - (fVar54 + fVar60) * fVar97) * fVar76 +
               ((fVar34 + fVar32) * fVar97 - (fVar79 + fVar33) * fStack_8d4) * local_8c8 +
               (fStack_8d4 * (fVar54 + fVar60) - (fVar34 + fVar32) * fVar93) * fStack_aa0;
          auVar48._8_4_ =
               (fStack_a70 * (fVar80 + fVar36) - (fVar55 + fVar61) * fVar98) * fVar76 +
               ((fVar37 + fVar35) * fVar98 - (fVar80 + fVar36) * fStack_8d0) * local_8c8 +
               (fStack_8d0 * (fVar55 + fVar61) - (fVar37 + fVar35) * fStack_a70) * fStack_aa0;
          auVar48._12_4_ =
               (fStack_a6c * (fVar81 + fVar39) - (fVar56 + fVar62) * fVar99) * fVar76 +
               ((fVar40 + fVar38) * fVar99 - (fVar81 + fVar39) * fStack_8cc) * local_8c8 +
               (fStack_8cc * (fVar56 + fVar62) - (fVar40 + fVar38) * fStack_a6c) * fStack_aa0;
          local_8b8 = local_a88 + local_888 + auVar48._0_4_;
          fStack_8b4 = fStack_a84 + fStack_884 + auVar48._4_4_;
          fStack_8b0 = fStack_a80 + local_a68._8_4_ + auVar48._8_4_;
          fStack_8ac = fStack_a7c + local_a68._12_4_ + auVar48._12_4_;
          auVar27._8_4_ = local_a68._8_4_;
          auVar27._0_8_ = local_a68._0_8_;
          auVar27._12_4_ = local_a68._12_4_;
          auVar8._4_4_ = fStack_a84;
          auVar8._0_4_ = local_a88;
          auVar8._8_4_ = fStack_a80;
          auVar8._12_4_ = fStack_a7c;
          auVar70 = minps(auVar27,auVar8);
          auVar70 = minps(auVar70,auVar48);
          auVar50._8_4_ = local_a68._8_4_;
          auVar50._0_8_ = local_a68._0_8_;
          auVar50._12_4_ = local_a68._12_4_;
          auVar9._4_4_ = fStack_a84;
          auVar9._0_4_ = local_a88;
          auVar9._8_4_ = fStack_a80;
          auVar9._12_4_ = fStack_a7c;
          auVar69 = maxps(auVar50,auVar9);
          auVar69 = maxps(auVar69,auVar48);
          fVar40 = ABS(local_8b8) * 1.1920929e-07;
          fVar56 = ABS(fStack_8b4) * 1.1920929e-07;
          fVar81 = ABS(fStack_8b0) * 1.1920929e-07;
          fVar23 = ABS(fStack_8ac) * 1.1920929e-07;
          auVar51._4_4_ = -(uint)(auVar69._4_4_ <= fVar56);
          auVar51._0_4_ = -(uint)(auVar69._0_4_ <= fVar40);
          auVar51._8_4_ = -(uint)(auVar69._8_4_ <= fVar81);
          auVar51._12_4_ = -(uint)(auVar69._12_4_ <= fVar23);
          auVar28._4_4_ = -(uint)(-fVar56 <= auVar70._4_4_);
          auVar28._0_4_ = -(uint)(-fVar40 <= auVar70._0_4_);
          auVar28._8_4_ = -(uint)(-fVar81 <= auVar70._8_4_);
          auVar28._12_4_ = -(uint)(-fVar23 <= auVar70._12_4_);
          auVar51 = auVar51 | auVar28;
          auVar52._0_4_ = auVar51._0_4_ & local_898._0_4_;
          auVar52._4_4_ = auVar51._4_4_ & local_898._4_4_;
          auVar52._8_4_ = auVar51._8_4_ & local_898._8_4_;
          auVar52._12_4_ = auVar51._12_4_ & local_898._12_4_;
          iVar13 = movmskps((int)local_9f0,auVar52);
          local_a48 = pIVar18;
          local_a18 = uVar14;
          if (iVar13 != 0) {
            fStack_8c4 = local_8c8;
            fStack_8c0 = local_8c8;
            fStack_8bc = local_8c8;
            auVar64._0_4_ = fVar82 * fVar95 - fVar63 * fVar92;
            auVar64._4_4_ = fVar84 * fVar97 - fVar65 * fVar93;
            auVar64._8_4_ = fVar85 * fVar98 - fVar66 * fStack_a70;
            auVar64._12_4_ = fVar86 * fVar99 - fVar67 * fStack_a6c;
            local_a78 = CONCAT44(fVar93,fVar92);
            auVar29._4_4_ = -(uint)(ABS(fVar84 * fVar91) < ABS(fVar65 * fVar93));
            auVar29._0_4_ = -(uint)(ABS(fVar82 * fVar89) < ABS(fVar63 * fVar92));
            auVar29._8_4_ = -(uint)(ABS(fVar85 * fStack_a30) < ABS(fVar66 * fStack_a70));
            auVar29._12_4_ = -(uint)(ABS(fVar86 * fStack_a2c) < ABS(fVar67 * fStack_a6c));
            auVar11._4_4_ = fStack_8a4 * fVar65 - fVar84 * fVar91;
            auVar11._0_4_ = local_8a8 * fVar63 - fVar82 * fVar89;
            auVar11._8_4_ = fStack_8a0 * fVar66 - fVar85 * fStack_a30;
            auVar11._12_4_ = fStack_89c * fVar67 - fVar86 * fStack_a2c;
            local_808 = blendvps(auVar64,auVar11,auVar29);
            auVar90._0_4_ = fVar63 * local_8d8 - fVar57 * fVar95;
            auVar90._4_4_ = fVar65 * fStack_8d4 - fVar58 * fVar97;
            auVar90._8_4_ = fVar66 * fStack_8d0 - fStack_a00 * fVar98;
            auVar90._12_4_ = fVar67 * fStack_8cc - fStack_9fc * fVar99;
            auVar30._4_4_ = -(uint)(ABS(fVar65 * fVar73) < ABS(fVar58 * fVar97));
            auVar30._0_4_ = -(uint)(ABS(fVar63 * fVar68) < ABS(fVar57 * fVar95));
            auVar30._8_4_ = -(uint)(ABS(fVar66 * fVar74) < ABS(fStack_a00 * fVar98));
            auVar30._12_4_ = -(uint)(ABS(fVar67 * fVar75) < ABS(fStack_9fc * fVar99));
            auVar10._4_4_ = fVar91 * fVar58 - fVar65 * fVar73;
            auVar10._0_4_ = fVar89 * fVar57 - fVar63 * fVar68;
            auVar10._8_4_ = fStack_a30 * fStack_a00 - fVar66 * fVar74;
            auVar10._12_4_ = fStack_a2c * fStack_9fc - fVar67 * fVar75;
            local_7f8 = blendvps(auVar90,auVar10,auVar30);
            auVar83._0_4_ = fVar57 * fVar92 - fVar82 * local_8d8;
            auVar83._4_4_ = fVar58 * fVar93 - fVar84 * fStack_8d4;
            auVar83._8_4_ = fStack_a00 * fStack_a70 - fVar85 * fStack_8d0;
            auVar83._12_4_ = fStack_9fc * fStack_a6c - fVar86 * fStack_8cc;
            auVar31._4_4_ = -(uint)(ABS(fVar58 * fStack_8a4) < ABS(fVar84 * fStack_8d4));
            auVar31._0_4_ = -(uint)(ABS(fVar57 * local_8a8) < ABS(fVar82 * local_8d8));
            auVar31._8_4_ = -(uint)(ABS(fStack_a00 * fStack_8a0) < ABS(fVar85 * fStack_8d0));
            auVar31._12_4_ = -(uint)(ABS(fStack_9fc * fStack_89c) < ABS(fVar86 * fStack_8cc));
            auVar12._4_4_ = fVar73 * fVar84 - fVar58 * fStack_8a4;
            auVar12._0_4_ = fVar68 * fVar82 - fVar57 * local_8a8;
            auVar12._8_4_ = fVar74 * fVar85 - fStack_a00 * fStack_8a0;
            auVar12._12_4_ = fVar75 * fVar86 - fStack_9fc * fStack_89c;
            local_7e8 = blendvps(auVar83,auVar12,auVar31);
            fVar40 = fVar76 * local_808._0_4_ +
                     local_8c8 * local_7f8._0_4_ + fStack_aa0 * local_7e8._0_4_;
            fVar56 = fVar76 * local_808._4_4_ +
                     local_8c8 * local_7f8._4_4_ + fStack_aa0 * local_7e8._4_4_;
            fVar81 = fVar76 * local_808._8_4_ +
                     local_8c8 * local_7f8._8_4_ + fStack_aa0 * local_7e8._8_4_;
            fVar76 = fVar76 * local_808._12_4_ +
                     local_8c8 * local_7f8._12_4_ + fStack_aa0 * local_7e8._12_4_;
            auVar71._0_4_ = fVar40 + fVar40;
            auVar71._4_4_ = fVar56 + fVar56;
            auVar71._8_4_ = fVar81 + fVar81;
            auVar71._12_4_ = fVar76 + fVar76;
            auVar45._0_4_ = local_a28 * local_7e8._0_4_;
            auVar45._4_4_ = fStack_a24 * local_7e8._4_4_;
            auVar45._8_4_ = fStack_a20 * local_7e8._8_4_;
            auVar45._12_4_ = fStack_a1c * local_7e8._12_4_;
            fVar23 = fVar94 * local_808._0_4_ + fVar87 * local_7f8._0_4_ + auVar45._0_4_;
            fVar24 = fVar96 * local_808._4_4_ + fVar88 * local_7f8._4_4_ + auVar45._4_4_;
            fVar25 = fStack_a40 * local_808._8_4_ + fStack_a10 * local_7f8._8_4_ + auVar45._8_4_;
            fVar32 = fStack_a3c * local_808._12_4_ + fStack_a0c * local_7f8._12_4_ + auVar45._12_4_;
            auVar70 = rcpps(auVar45,auVar71);
            fVar40 = auVar70._0_4_;
            fVar56 = auVar70._4_4_;
            fVar81 = auVar70._8_4_;
            fVar76 = auVar70._12_4_;
            local_818._0_4_ =
                 (((float)DAT_01f7ba10 - auVar71._0_4_ * fVar40) * fVar40 + fVar40) *
                 (fVar23 + fVar23);
            local_818._4_4_ =
                 ((DAT_01f7ba10._4_4_ - auVar71._4_4_ * fVar56) * fVar56 + fVar56) *
                 (fVar24 + fVar24);
            local_818._8_4_ =
                 ((DAT_01f7ba10._8_4_ - auVar71._8_4_ * fVar81) * fVar81 + fVar81) *
                 (fVar25 + fVar25);
            local_818._12_4_ =
                 ((DAT_01f7ba10._12_4_ - auVar71._12_4_ * fVar76) * fVar76 + fVar76) *
                 (fVar32 + fVar32);
            fVar40 = *(float *)&(pIVar18->intersector1).intersect;
            fVar56 = *(float *)((long)&pIVar18->leafIntersector + 4);
            auVar72._0_4_ =
                 (int)((uint)(auVar71._0_4_ != 0.0 &&
                             (local_818._0_4_ <= fVar40 && fVar56 <= local_818._0_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar72._4_4_ =
                 (int)((uint)(auVar71._4_4_ != 0.0 &&
                             (local_818._4_4_ <= fVar40 && fVar56 <= local_818._4_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar72._8_4_ =
                 (int)((uint)(auVar71._8_4_ != 0.0 &&
                             (local_818._8_4_ <= fVar40 && fVar56 <= local_818._8_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar72._12_4_ =
                 (int)((uint)(auVar71._12_4_ != 0.0 &&
                             (local_818._12_4_ <= fVar40 && fVar56 <= local_818._12_4_)) *
                      -0x80000000) >> 0x1f;
            uVar15 = movmskps(iVar13,auVar72 & auVar52);
            if (uVar15 != 0) {
              local_aa8 = local_aa8 + uVar22;
              fStack_880 = local_a68._8_4_;
              fStack_87c = local_a68._12_4_;
              local_878._4_4_ = fStack_a84;
              local_878._0_4_ = local_a88;
              local_878._8_4_ = fStack_a80;
              local_878._12_4_ = fStack_a7c;
              local_868._4_4_ = fStack_8b4;
              local_868._0_4_ = local_8b8;
              local_868._8_4_ = fStack_8b0;
              local_868._12_4_ = fStack_8ac;
              local_858 = &local_aa9;
              local_848 = auVar72 & auVar52;
              auVar70 = rcpps(local_818,local_868);
              fVar40 = auVar70._0_4_;
              fVar56 = auVar70._4_4_;
              fVar81 = auVar70._8_4_;
              fVar76 = auVar70._12_4_;
              fVar40 = (float)(-(uint)(1e-18 <= ABS(local_8b8)) &
                              (uint)(((float)DAT_01f7ba10 - local_8b8 * fVar40) * fVar40 + fVar40));
              fVar56 = (float)(-(uint)(1e-18 <= ABS(fStack_8b4)) &
                              (uint)((DAT_01f7ba10._4_4_ - fStack_8b4 * fVar56) * fVar56 + fVar56));
              fVar81 = (float)(-(uint)(1e-18 <= ABS(fStack_8b0)) &
                              (uint)((DAT_01f7ba10._8_4_ - fStack_8b0 * fVar81) * fVar81 + fVar81));
              fVar76 = (float)(-(uint)(1e-18 <= ABS(fStack_8ac)) &
                              (uint)((DAT_01f7ba10._12_4_ - fStack_8ac * fVar76) * fVar76 + fVar76))
              ;
              auVar53._0_4_ = local_888 * fVar40;
              auVar53._4_4_ = fStack_884 * fVar56;
              auVar53._8_4_ = local_a68._8_4_ * fVar81;
              auVar53._12_4_ = local_a68._12_4_ * fVar76;
              local_838 = minps(auVar53,_DAT_01f7ba10);
              auVar78._0_4_ = fVar40 * local_a88;
              auVar78._4_4_ = fVar56 * fStack_a84;
              auVar78._8_4_ = fVar81 * fStack_a80;
              auVar78._12_4_ = fVar76 * fStack_a7c;
              local_828 = minps(auVar78,_DAT_01f7ba10);
              uVar14 = (ulong)(uVar15 & 0xff);
              local_a08 = *(long *)&(local_a98->org).field_0;
              fStack_a9c = fStack_aa0;
              do {
                uVar7 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                local_9d0 = *(uint *)(local_aa8 + 0x90 + uVar7 * 4);
                local_a78 = *(long *)(*(long *)(local_a08 + 0x1e8) + (ulong)local_9d0 * 8);
                if ((*(uint *)(local_a78 + 0x34) &
                    *(uint *)((long)&(local_a48->intersector1).intersect + 4)) == 0) {
                  uVar14 = uVar14 ^ 1L << (uVar7 & 0x3f);
                }
                else {
                  local_a88 = (float)uVar7;
                  fStack_a84 = (float)(uVar7 >> 0x20);
                  local_a68._0_8_ = uVar14;
                  pbVar19 = *(byte **)&(local_a98->dir).field_0;
                  if ((*(long *)(pbVar19 + 0x10) == 0) && (*(long *)(local_a78 + 0x48) == 0)) {
LAB_0021aeaf:
                    *(undefined4 *)&(local_a48->intersector1).intersect = 0xff800000;
                    return;
                  }
                  local_9a8 = *(undefined4 **)((long)&(local_a98->org).field_0 + 8);
                  local_9e8 = *(undefined4 *)(local_808 + uVar7 * 4);
                  local_9e4 = *(undefined4 *)(local_7f8 + uVar7 * 4);
                  local_9e0 = *(undefined4 *)(local_7e8 + uVar7 * 4);
                  local_9dc = *(undefined4 *)(local_838 + uVar7 * 4);
                  local_9d8 = *(undefined4 *)(local_828 + uVar7 * 4);
                  local_9d4 = *(undefined4 *)(local_aa8 + 0xa0 + uVar7 * 4);
                  local_9cc = *local_9a8;
                  local_9c8 = local_9a8[1];
                  local_a28 = (float)*(undefined4 *)&(local_a48->intersector1).intersect;
                  *(undefined4 *)&(local_a48->intersector1).intersect =
                       *(undefined4 *)(local_818 + uVar7 * 4);
                  local_a8c = -1;
                  local_9b8 = &local_a8c;
                  local_9b0 = *(undefined8 *)(local_a78 + 0x18);
                  local_998 = &local_9e8;
                  local_990 = 1;
                  local_9a0 = local_a48;
                  if (((*(code **)(local_a78 + 0x48) == (code *)0x0) ||
                      (local_a38 = pbVar19, (**(code **)(local_a78 + 0x48))(&local_9b8),
                      pbVar19 = local_a38, *local_9b8 != 0)) &&
                     ((*(code **)(pbVar19 + 0x10) == (code *)0x0 ||
                      ((((*pbVar19 & 2) == 0 && ((*(byte *)(local_a78 + 0x3e) & 0x40) == 0)) ||
                       ((**(code **)(pbVar19 + 0x10))(&local_9b8), *local_9b8 != 0))))))
                  goto LAB_0021aeaf;
                  *(float *)&(local_a48->intersector1).intersect = local_a28;
                  uVar14 = local_a68._0_8_ ^ 1L << ((ulong)(uint)local_a88 & 0x3f);
                }
                puVar16 = local_a50;
              } while (uVar14 != 0);
            }
          }
          local_9f0 = (RayQueryContext *)((long)&local_9f0->scene + 1);
          pIVar18 = local_a48;
          uVar14 = local_a18;
        } while (local_9f0 != local_9f8);
      }
LAB_0021ae9f:
      context = local_9f8;
    } while (puVar16 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }